

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::applyConvertIn<QCmyk32>
          (QColorTransformPrivate *this,QCmyk32 *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  bool bVar1;
  Int IVar2;
  const_iterator o;
  anon_class_16_2_4b7f43a0 *__visitor;
  QColorVector *in_RCX;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *in_RDI;
  long in_FS_OFFSET;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *element;
  QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
  *in_stack_ffffffffffffff90;
  QCmyk32 *in_stack_ffffffffffffff98;
  const_iterator local_28;
  QFlagsStorageHelper<QColorTransformPrivate::TransformFlag,_4> local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c.super_QFlagsStorage<QColorTransformPrivate::TransformFlag>.i =
       (QFlagsStorage<QColorTransformPrivate::TransformFlag>)
       QFlags<QColorTransformPrivate::TransformFlag>::operator&
                 ((QFlags<QColorTransformPrivate::TransformFlag> *)in_stack_ffffffffffffff90,
                  (TransformFlag)((ulong)in_RDI >> 0x20));
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar2 == 0) {
    loadUnpremultipliedLUT(in_RCX,in_stack_ffffffffffffff98,(qsizetype)in_stack_ffffffffffffff90);
  }
  else {
    loadPremultipliedLUT();
  }
  QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
            ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d4a30);
  local_28.i = (variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
             ::begin(in_stack_ffffffffffffff90);
  o = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
      ::end(in_stack_ffffffffffffff90);
  while( true ) {
    bVar1 = QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
            ::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    __visitor = (anon_class_16_2_4b7f43a0 *)
                QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
                ::const_iterator::operator*(&local_28);
    std::
    visit<QColorTransformPrivate::applyConvertIn<QCmyk32>(QCmyk32_const*,QColorVector*,long_long,QFlags<QColorTransformPrivate::TransformFlag>)const::_lambda(auto:1&&)_1_,std::variant<QColorSpacePrivate::TransferElement,QColorMatrix,QColorVector,QColorCLUT>const&>
              (__visitor,in_RDI);
    QList<std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_>
    ::const_iterator::operator++(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}